

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

MPP_RET fps_calc_init(FpsCalc *ctx)

{
  FpsCalc pvVar1;
  MPP_RET local_1c;
  MPP_RET ret;
  FpsCalcImpl *impl;
  FpsCalc *ctx_local;
  
  pvVar1 = (FpsCalc)mpp_osal_calloc("fps_calc_init",0x40);
  local_1c = MPP_NOK;
  if (pvVar1 != (FpsCalc)0x0) {
    mpp_spinlock_init(pvVar1);
    local_1c = MPP_OK;
  }
  *ctx = pvVar1;
  return local_1c;
}

Assistant:

MPP_RET fps_calc_init(FpsCalc *ctx)
{
    FpsCalcImpl *impl = mpp_calloc(FpsCalcImpl, 1);
    MPP_RET ret = MPP_NOK;

    if (impl) {
        mpp_spinlock_init(&impl->lock);
        ret = MPP_OK;
    }
    *ctx = impl;

    return ret;
}